

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_object.cpp
# Opt level: O2

void __thiscall
mjs::native_error_exception::native_error_exception
          (native_error_exception *this,native_error_type type,wstring_view *stack_trace,
          string_view *msg)

{
  wchar_t *local_50;
  size_t local_48;
  wchar_t local_40 [4];
  wstring_view local_30;
  
  local_50 = local_40;
  std::__cxx11::wstring::_M_construct<char_const*>
            ((wstring *)&local_50,msg->_M_str,msg->_M_str + msg->_M_len);
  local_30._M_len = local_48;
  local_30._M_str = local_50;
  native_error_exception(this,type,stack_trace,&local_30);
  std::__cxx11::wstring::~wstring((wstring *)&local_50);
  return;
}

Assistant:

native_error_exception::native_error_exception(native_error_type type, const std::wstring_view& stack_trace, const std::string_view& msg)
    : native_error_exception{type, stack_trace, std::wstring{msg.begin(), msg.end()}} {
}